

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O1

int __thiscall Timidity::Renderer::allocate_voice(Renderer *this)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  Voice *pVVar4;
  float *pfVar5;
  float fVar6;
  
  uVar3 = this->voices;
  uVar2 = (ulong)(int)uVar3;
  if (0 < (long)uVar2) {
    pVVar4 = this->voice;
    uVar1 = 0;
    do {
      if ((pVVar4->status & 1) == 0) goto LAB_00352d0e;
      uVar1 = uVar1 + 1;
      pVVar4 = pVVar4 + 1;
    } while (uVar2 != uVar1);
  }
  if (uVar3 == 0) {
    uVar1 = 0xffffffff;
  }
  else {
    pfVar5 = &this->voice[uVar2 - 1].attenuation;
    uVar1 = 0xffffffff;
    fVar6 = 1e+10;
    do {
      uVar3 = uVar3 - 1;
      if (((((Voice *)(pfVar5 + -0x32))->status & 0xc) == 4) && (*pfVar5 < fVar6)) {
        uVar1 = (ulong)uVar3;
        fVar6 = *pfVar5;
      }
      uVar2 = uVar2 - 1;
      pfVar5 = pfVar5 + -0x5c;
    } while (uVar2 != 0);
  }
  if ((int)uVar1 < 0) {
    this->lost_notes = this->lost_notes + 1;
    return (int)uVar1;
  }
  this->cut_notes = this->cut_notes + 1;
  this->voice[uVar1].status = '\0';
LAB_00352d0e:
  return (int)uVar1;
}

Assistant:

int Renderer::allocate_voice()
{
	int i, lowest;
	float lv, v;

	for (i = 0; i < voices; ++i)
	{
		if (!(voice[i].status & VOICE_RUNNING))
		{
			return i; /* Can't get a lower volume than silence */
		}
	}

	/* Look for the decaying note with the lowest volume */
	lowest = -1;
	lv = 1e10;
	i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RELEASING) && !(voice[i].status & VOICE_STOPPING))
		{
			v = voice[i].attenuation;
			if (v < lv)
			{
				lv = v;
				lowest = i;
			}
		}
	}

	if (lowest >= 0)
	{
		/* This can still cause a click, but if we had a free voice to
		   spare for ramping down this note, we wouldn't need to kill it
		   in the first place... Still, this needs to be fixed. Perhaps
		   we could use a reserve of voices to play dying notes only. */

		cut_notes++;
		voice[lowest].status = 0;
	}
	else
	{
		lost_notes++;
	}
	return lowest;
}